

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

mecab_learner_node_t * __thiscall
MeCab::FreeList<mecab_learner_node_t>::alloc(FreeList<mecab_learner_node_t> *this)

{
  iterator __position;
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  mecab_learner_node_t *local_18;
  
  if (*(ulong *)(this + 0x20) == *(ulong *)(this + 0x30)) {
    *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
    *(undefined8 *)(this + 0x20) = 0;
  }
  __position._M_current = *(mecab_learner_node_t ***)(this + 0x10);
  if (*(long *)(this + 0x28) == (long)__position._M_current - *(long *)(this + 8) >> 3) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(this + 0x30);
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x98),8) == 0) {
      uVar4 = SUB168(auVar3 * ZEXT816(0x98),0);
    }
    local_18 = (mecab_learner_node_t *)operator_new__(uVar4);
    if (__position._M_current == *(mecab_learner_node_t ***)(this + 0x18)) {
      std::vector<mecab_learner_node_t*,std::allocator<mecab_learner_node_t*>>::
      _M_realloc_insert<mecab_learner_node_t*>
                ((vector<mecab_learner_node_t*,std::allocator<mecab_learner_node_t*>> *)(this + 8),
                 __position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 8;
    }
  }
  lVar1 = *(long *)(this + 0x20);
  lVar2 = *(long *)(*(long *)(this + 8) + *(long *)(this + 0x28) * 8);
  *(long *)(this + 0x20) = lVar1 + 1;
  return (mecab_learner_node_t *)(lVar1 * 0x98 + lVar2);
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }